

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

ON_Locale *
ON_Locale::FromWindowsLCIDAndName
          (ON_Locale *__return_storage_ptr__,ON__UINT32 windows_lcid,char *name)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *s;
  char *buffer_end;
  ON_Locale locale;
  char *name_local;
  ON__UINT32 windows_lcid_local;
  
  locale._152_8_ = name;
  if (windows_lcid == 0) {
    memcpy(__return_storage_ptr__,&Ordinal,0xa0);
  }
  else if (windows_lcid == 0x27) {
    memcpy(__return_storage_ptr__,&InvariantCulture,0xa0);
  }
  else if ((name == (char *)0x0) || (*name == '\0')) {
    memcpy(__return_storage_ptr__,&InvariantCulture,0xa0);
  }
  else {
    ON_Locale((ON_Locale *)&buffer_end);
    locale.m_reserved2._13_4_ = windows_lcid;
    bVar1 = ParseName((char *)locale._152_8_,-1,locale.m_bcp47_language_tag + 0x4d,9,(char *)0x0,0,
                      locale.m_language_subtag + 1,5,locale.m_language_subtag + 6,5,
                      locale.m_script_subtag + 2,7);
    if (bVar1) {
      if (locale.m_bcp47_language_tag[0x4d] == '\0') {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                   ,0x39f,"","ParseLocaleName() returned empty language name.");
        memcpy(__return_storage_ptr__,&Ordinal,0xa0);
      }
      else if (locale.m_bcp47_language_tag[0x4e] == '\0') {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                   ,0x3a5,"","ParseLocaleName() returned invalid language name.");
        memcpy(__return_storage_ptr__,&Ordinal,0xa0);
      }
      else {
        pcVar2 = LocaleStringBuilderDestEnd((char *)&locale.m_string_coll_map_locale,0x55);
        pcVar3 = LocaleStringBuilder('\0',locale.m_bcp47_language_tag + 0x4d,9,
                                     (char *)&locale.m_string_coll_map_locale,pcVar2);
        pcVar3 = LocaleStringBuilder('-',locale.m_language_subtag + 1,5,pcVar3,pcVar2);
        pcVar2 = LocaleStringBuilder('-',locale.m_language_subtag + 6,5,pcVar3,pcVar2);
        if (pcVar2 == (char *)0x0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                     ,0x3b0,"","Unable to create m_bcp47_language_tag.");
          memcpy(__return_storage_ptr__,&Ordinal,0xa0);
        }
        else {
          buffer_end = (char *)ON_CRT_C_locale();
          locale.m_numeric_locale =
               ON_CRT_create_locale_ALL((char *)&locale.m_string_coll_map_locale);
          if (locale.m_numeric_locale == 0) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                       ,0x3b9,"","ON_CRT_create_locale(LC_ALL, locale.m_bcp47_language_tag) failed."
                      );
            memcpy(__return_storage_ptr__,&Ordinal,0xa0);
          }
          else {
            memcpy(__return_storage_ptr__,&buffer_end,0xa0);
          }
        }
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                 ,0x399,"","ParseLocaleName() failed.");
      memcpy(__return_storage_ptr__,&Ordinal,0xa0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Locale ON_Locale::FromWindowsLCIDAndName(
  ON__UINT32 windows_lcid,
  const char* name
  )
{
  if ( windows_lcid == ON_Locale::OrdinalLCID )
    return ON_Locale::Ordinal;

  if ( windows_lcid == ON_Locale::InvariantCultureLCID )
    return ON_Locale::InvariantCulture;

  if (0 == name || 0 == name[0])
  {
    return ON_Locale::InvariantCulture;
  }
  
  ON_Locale locale;

  locale.m_windows_lcid = windows_lcid;

  if (false == ON_Locale::ParseName(
    name,
    -1,
    locale.m_language_subtag, sizeof(locale.m_language_subtag) / sizeof(locale.m_language_subtag[0]),
    nullptr, 0,
    locale.m_script_subtag, sizeof(locale.m_script_subtag) / sizeof(locale.m_script_subtag[0]),
    locale.m_region_subtag, sizeof(locale.m_region_subtag) / sizeof(locale.m_region_subtag[0]),
    locale.m_windows_sortorder, sizeof(locale.m_windows_sortorder) / sizeof(locale.m_windows_sortorder[0])
    ))
  {
    ON_ERROR("ParseLocaleName() failed.");
    return ON_Locale::Ordinal;
  }

  if (0 == locale.m_language_subtag[0])
  {
    ON_ERROR("ParseLocaleName() returned empty language name.");
    return ON_Locale::Ordinal;
  }

  if (0 == locale.m_language_subtag[1])
  {
    ON_ERROR("ParseLocaleName() returned invalid language name.");
    return ON_Locale::Ordinal;
  }

  char* buffer_end = LocaleStringBuilderDestEnd(locale.m_bcp47_language_tag,sizeof(locale.m_bcp47_language_tag)/sizeof(locale.m_bcp47_language_tag[0]));
  char* s = locale.m_bcp47_language_tag;
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG(0,locale.m_language_subtag),s,buffer_end);
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-',locale.m_script_subtag),s,buffer_end);
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-',locale.m_region_subtag),s,buffer_end);
  if (nullptr == s)
  {
    ON_ERROR("Unable to create m_bcp47_language_tag.");
    return ON_Locale::Ordinal;
  }
  
  locale.m_numeric_locale = ON_CRT_C_locale();

  locale.m_string_coll_map_locale = ON_CRT_create_locale_ALL( locale.m_bcp47_language_tag );
  if (0 == locale.m_string_coll_map_locale)
  {
    ON_ERROR("ON_CRT_create_locale(LC_ALL, locale.m_bcp47_language_tag) failed.");
    return ON_Locale::Ordinal;
  }

  return locale;
}